

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.c
# Opt level: O3

int lyext_clean_plugins(void)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = 1;
  if (ext_plugins_ref == 0) {
    iVar1 = 0;
    if (ext_plugins_count != 0) {
      pthread_mutex_lock((pthread_mutex_t *)&ext_lock);
      free(ext_plugins);
      ext_plugins = (lyext_plugin_list *)0x0;
      ext_plugins_count = 0;
      if (dlhandlers.number != 0) {
        uVar2 = 0;
        do {
          dlclose(dlhandlers.set.s[uVar2]);
          uVar2 = uVar2 + 1;
        } while (uVar2 < (ulong)dlhandlers._0_8_ >> 0x20);
      }
      free(dlhandlers.set.s);
      dlhandlers.size = 0;
      dlhandlers.number = 0;
      dlhandlers.set.s = (lys_node **)0x0;
      pthread_mutex_unlock((pthread_mutex_t *)&ext_lock);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

API int
lyext_clean_plugins(void)
{
    unsigned int u;

    if (ext_plugins_ref) {
        /* there is a context that may refer to the plugins, so we cannot remove them */
        return EXIT_FAILURE;
    }

    if (!ext_plugins_count) {
        /* no plugin loaded - nothing to do */
        return EXIT_SUCCESS;
    }

    /* lock the extension plugins list */
    pthread_mutex_lock(&ext_lock);

    /* clean the list */
    free(ext_plugins);
    ext_plugins = NULL;
    ext_plugins_count = 0;

    /* close the dl handlers */
    for (u = 0; u < dlhandlers.number; u++) {
        dlclose(dlhandlers.set.g[u]);
    }
    free(dlhandlers.set.g);
    dlhandlers.set.g = NULL;
    dlhandlers.size = 0;
    dlhandlers.number = 0;

    /* unlock the global structures */
    pthread_mutex_unlock(&ext_lock);

    return EXIT_SUCCESS;
}